

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depth_to_bgr.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  initializer_list<cv::Mat> __l;
  string data_dir;
  vector<cv::Mat,_std::allocator<cv::Mat>_> images;
  Mat viz;
  Mat depth_normalized;
  Mat depth_bgr;
  Mat depth;
  Mat bgr;
  long *local_668 [2];
  long local_658 [2];
  void *local_648;
  undefined8 uStack_640;
  long local_638;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  long *local_568;
  long local_560;
  long local_558 [2];
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_548;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_530;
  long *local_518;
  _InputArray *local_510;
  long local_508 [10];
  Mat local_4b8 [16];
  Mat local_4a8 [80];
  Mat local_458 [16];
  Mat local_448 [144];
  Vec2i local_3b8;
  _InputArray local_3b0 [4];
  _InputArray local_350;
  _InputArray local_338 [4];
  _InputArray local_2d8 [4];
  string local_278 [96];
  Mat local_218 [96];
  Mat local_1b8 [96];
  Mat local_158 [96];
  Mat local_f8 [96];
  Mat local_98 [96];
  Scalar local_38;
  
  if (argc != 2) {
    __assert_fail("argc == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/examples/depth_to_bgr.cpp"
                  ,4,"int main(int, char **)");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,argv[1],(allocator<char> *)&local_518);
  local_518 = local_508;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_518,local_568,local_560 + (long)local_568);
  std::__cxx11::string::append((char *)&local_518);
  cv::imread(local_278,(int)&local_518);
  if (local_518 != local_508) {
    operator_delete(local_518,local_508[0] + 1);
  }
  local_518 = local_508;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_518,local_568,local_560 + (long)local_568);
  std::__cxx11::string::append((char *)&local_518);
  cv::imread((string *)local_2d8,(int)&local_518);
  if (local_518 != local_508) {
    operator_delete(local_518,local_508[0] + 1);
  }
  if ((local_2d8[0].flags & 0xfffU) == 2) {
    local_508[0] = 0;
    local_518._0_4_ = 0x2010000;
    local_510 = local_2d8;
    cv::Mat::convertTo((_OutputArray *)local_2d8,(int)&local_518,1.0,0.0);
    local_668[0] = (long *)0x7ff8000000000000;
    local_3b0[0].flags = -0x3efdfffa;
    local_3b0[0].sz.width = 1;
    local_3b0[0].sz.height = 1;
    local_3b0[0].obj = local_668;
    cv::operator==((Mat *)&local_518,0.0);
    cv::_InputArray::_InputArray(local_338,(MatExpr *)&local_518);
    cv::Mat::setTo(local_2d8,local_3b0);
    cv::Mat::~Mat(local_448);
    cv::Mat::~Mat(local_4a8);
    cv::Mat::~Mat((Mat *)local_508);
    local_508[0] = 0;
    local_518._0_4_ = 0x2010000;
    local_510 = local_2d8;
    cv::Mat::convertTo((_OutputArray *)local_2d8,(int)&local_518,0.001,0.0);
    cv::Mat::Mat(local_98,(Mat *)local_2d8);
    imgviz::normalize((imgviz *)local_3b0,local_98,0.3,1.0);
    cv::Mat::~Mat(local_98);
    local_508[0] = 0;
    local_518._0_4_ = 0x2010000;
    local_510 = local_3b0;
    cv::Mat::convertTo((_OutputArray *)local_3b0,(int)&local_518,255.0,0.0);
    local_508[0] = 0;
    local_518 = (long *)CONCAT44(local_518._4_4_,0x2010000);
    local_510 = local_3b0;
    cv::Mat::convertTo((_OutputArray *)local_3b0,(int)&local_518,1.0,0.0);
    cv::Mat::Mat(local_f8,(Mat *)local_2d8);
    imgviz::depthToBgr((imgviz *)local_338,local_f8,0.3,1.0);
    cv::Mat::~Mat(local_f8);
    cv::Mat::Mat(local_158,(Mat *)local_278);
    local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"bgr","");
    local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"lt+","");
    imgviz::textInRectangle((imgviz *)&local_518,local_158,&local_588,&local_5a8,0,1.0,2);
    cv::Mat::operator=((Mat *)local_278,(Mat *)&local_518);
    cv::Mat::~Mat((Mat *)&local_518);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
      operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
    }
    cv::Mat::~Mat(local_158);
    cv::Mat::Mat(local_1b8,(Mat *)local_3b0);
    local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"depth_normalized","");
    local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"lt+","");
    imgviz::textInRectangle((imgviz *)&local_518,local_1b8,&local_5c8,&local_5e8,0,1.0,2);
    cv::Mat::operator=((Mat *)local_3b0,(Mat *)&local_518);
    cv::Mat::~Mat((Mat *)&local_518);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
      operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
      operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
    }
    cv::Mat::~Mat(local_1b8);
    cv::Mat::Mat(local_218,(Mat *)local_338);
    local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"depth_bgr","");
    local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"lt+","");
    imgviz::textInRectangle((imgviz *)&local_518,local_218,&local_608,&local_628,0,1.0,2);
    cv::Mat::operator=((Mat *)local_338,(Mat *)&local_518);
    cv::Mat::~Mat((Mat *)&local_518);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._M_dataplus._M_p != &local_628.field_2) {
      operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608._M_dataplus._M_p != &local_608.field_2) {
      operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
    }
    cv::Mat::~Mat(local_218);
    cv::Mat::Mat((Mat *)&local_518,(Mat *)local_278);
    cv::Mat::Mat(local_4b8,(Mat *)local_3b0);
    cv::Mat::Mat(local_458,(Mat *)local_338);
    __l._M_len = 3;
    __l._M_array = (iterator)&local_518;
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
              (&local_530,__l,(allocator_type *)local_668);
    lVar2 = 0xc0;
    do {
      cv::Mat::~Mat((Mat *)((long)&local_518 + lVar2));
      lVar2 = lVar2 + -0x60;
    } while (lVar2 != -0x60);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector(&local_548,&local_530);
    local_3b8.super_Matx<int,_2,_1>.val = (Matx<int,_2,_1>)(int  [2])0x300000001;
    local_38.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 255.0;
    local_38.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 255.0;
    local_38.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 255.0;
    local_38.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
    imgviz::tile((imgviz *)&local_518,&local_548,&local_3b8,5,&local_38);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_548);
    local_668[0] = local_658;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_668,"depth_to_bgr.png","");
    local_350.sz.width = 0;
    local_350.sz.height = 0;
    local_350.flags = 0x1010000;
    local_638 = 0;
    local_648 = (void *)0x0;
    uStack_640 = 0;
    local_350.obj = (imgviz *)&local_518;
    cv::imwrite((string *)local_668,&local_350,(vector *)&local_648);
    if (local_648 != (void *)0x0) {
      operator_delete(local_648,local_638 - (long)local_648);
    }
    if (local_668[0] != local_658) {
      operator_delete(local_668[0],local_658[0] + 1);
    }
    pcVar1 = getenv("CI");
    if (pcVar1 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_668,*argv,(allocator<char> *)&local_648);
      local_350.sz.width = 0;
      local_350.sz.height = 0;
      local_350.flags = 0x1010000;
      local_350.obj = (imgviz *)&local_518;
      cv::imshow((string *)local_668,&local_350);
      if (local_668[0] != local_658) {
        operator_delete(local_668[0],local_658[0] + 1);
      }
      cv::waitKey(0);
    }
    cv::Mat::~Mat((Mat *)&local_518);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_530);
    cv::Mat::~Mat((Mat *)local_338);
    cv::Mat::~Mat((Mat *)local_3b0);
    cv::Mat::~Mat((Mat *)local_2d8);
    cv::Mat::~Mat((Mat *)local_278);
    if (local_568 != local_558) {
      operator_delete(local_568,local_558[0] + 1);
    }
    return 0;
  }
  __assert_fail("depth.type() == CV_16UC1",
                "/workspace/llm4binary/github/license_c_cmakelists/wkentaro[P]imgviz-cpp/examples/depth_to_bgr.cpp"
                ,9,"int main(int, char **)");
}

Assistant:

int main(int argc, char **argv) {
  assert(argc == 2);

  std::string data_dir = std::string(argv[1]);
  cv::Mat bgr = cv::imread(data_dir + "/rgb.png");
  cv::Mat depth = cv::imread(data_dir + "/depth.png", -1);
  assert(depth.type() == CV_16UC1);
  depth.convertTo(depth, CV_32FC1);
  depth.setTo(NAN, depth == 0);
  depth /= 1000;

  cv::Mat depth_normalized =
      imgviz::normalize(depth, /*min_val=*/0.3, /*max_val=*/1);
  depth_normalized *= 255;
  depth_normalized.convertTo(depth_normalized, CV_8UC1);

  cv::Mat depth_bgr = imgviz::depthToBgr(depth, /*min_val=*/0.3, /*max_val=*/1);

  bgr = imgviz::textInRectangle(bgr, "bgr");
  depth_normalized =
      imgviz::textInRectangle(depth_normalized, "depth_normalized");
  depth_bgr = imgviz::textInRectangle(depth_bgr, "depth_bgr");

  std::vector<cv::Mat> images = {bgr, depth_normalized, depth_bgr};
  cv::Mat viz = imgviz::tile(images, /*shape=*/cv::Vec2i(1, 3));

  cv::imwrite("depth_to_bgr.png", viz);
  if (!std::getenv("CI")) {
    cv::imshow(argv[0], viz);
    cv::waitKey(0);
  }
}